

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.cpp
# Opt level: O0

ostream * ccd::Json::operator<<(ostream *os,Object *obj)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  pointer ppVar4;
  _Self local_48;
  _Base_ptr local_40;
  _Self local_38;
  _Self local_30;
  _Self local_28;
  const_iterator item;
  long *indentLvl;
  Object *obj_local;
  ostream *os_local;
  
  if ((operator<<(std::ostream&,std::map<std::__cxx11::string,ccd::Json::Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ccd::Json::Value>>>const&)
       ::indentLvlIdx == '\0') &&
     (iVar2 = __cxa_guard_acquire(&operator<<(std::ostream&,std::map<std::__cxx11::string,ccd::Json::Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ccd::Json::Value>>>const&)
                                   ::indentLvlIdx), iVar2 != 0)) {
    operator<<::indentLvlIdx = std::ios_base::xalloc();
    __cxa_guard_release(&operator<<(std::ostream&,std::map<std::__cxx11::string,ccd::Json::Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ccd::Json::Value>>>const&)
                         ::indentLvlIdx);
  }
  item._M_node = (_Base_ptr)
                 std::ios_base::iword
                           ((ios_base *)(os + *(long *)(*(long *)os + -0x18)),
                            operator<<::indentLvlIdx);
  std::operator<<(os,"{\n");
  *(long *)item._M_node = *(long *)item._M_node + 1;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccd::Json::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccd::Json::Value>_>_>
       ::cbegin(obj);
  while( true ) {
    local_30._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccd::Json::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccd::Json::Value>_>_>
         ::cend(obj);
    bVar1 = std::operator!=(&local_28,&local_30);
    if (!bVar1) break;
    indent(os,(int)*(undefined8 *)item._M_node);
    poVar3 = std::operator<<(os,"\"");
    ppVar4 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccd::Json::Value>_>
             ::operator->(&local_28);
    poVar3 = std::operator<<(poVar3,(string *)ppVar4);
    poVar3 = std::operator<<(poVar3,"\":");
    ppVar4 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccd::Json::Value>_>
             ::operator->(&local_28);
    operator<<(poVar3,&ppVar4->second);
    local_40 = local_28._M_node;
    local_38._M_node =
         (_Base_ptr)
         std::
         next<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,ccd::Json::Value>>>
                   (local_28._M_node,1);
    local_48._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccd::Json::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccd::Json::Value>_>_>
         ::cend(obj);
    bVar1 = std::operator!=(&local_38,&local_48);
    if (bVar1) {
      std::operator<<(os,",\n");
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ccd::Json::Value>_>
    ::operator++(&local_28);
  }
  std::operator<<(os,"\n");
  *(long *)item._M_node = *(long *)item._M_node + -1;
  indent(os,(int)*(undefined8 *)item._M_node);
  std::operator<<(os,"}");
  return os;
}

Assistant:

std::ostream& operator<< ( std::ostream& os, const Object& obj )
{
	static const int indentLvlIdx =  os.xalloc();
	auto& indentLvl = os.iword(indentLvlIdx);
	os << "{\n";
	indentLvl++;

	for ( auto item = obj.cbegin() ; item != obj.cend(); ++item ) {
		indent ( os, indentLvl );
		os << "\"" << item->first << "\":" << item->second;
		if ( std::next(item, 1) != obj.cend() )
			os << ",\n";
	}
	os << "\n";

	indentLvl--;
	indent ( os, indentLvl );
	os << "}";

	return os;
}